

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppnet_base.cpp
# Opt level: O0

void __thiscall cppnet::CppNetBase::Init(CppNetBase *this,uint32_t thread_num)

{
  RangeRandom *this_00;
  enable_shared_from_this<cppnet::CppNetBase> local_d8;
  undefined1 local_c8 [8];
  shared_ptr<cppnet::Dispatcher> dispatcher;
  undefined1 local_b0 [4];
  uint32_t i;
  sigset_t set;
  unique_ptr<cppnet::RangeRandom,_std::default_delete<cppnet::RangeRandom>_> local_20;
  uint32_t local_18;
  uint local_14;
  uint32_t cpus;
  uint32_t thread_num_local;
  CppNetBase *this_local;
  
  local_14 = thread_num;
  _cpus = this;
  local_18 = GetCpuNum();
  if ((local_14 == 0) || (local_18 << 1 <= local_14)) {
    local_14 = local_18;
  }
  this_00 = (RangeRandom *)operator_new(8);
  RangeRandom::RangeRandom(this_00,0,local_14 - 1);
  std::unique_ptr<cppnet::RangeRandom,std::default_delete<cppnet::RangeRandom>>::
  unique_ptr<std::default_delete<cppnet::RangeRandom>,void>
            ((unique_ptr<cppnet::RangeRandom,std::default_delete<cppnet::RangeRandom>> *)&local_20,
             this_00);
  std::unique_ptr<cppnet::RangeRandom,_std::default_delete<cppnet::RangeRandom>_>::operator=
            (&this->_random,&local_20);
  std::unique_ptr<cppnet::RangeRandom,_std::default_delete<cppnet::RangeRandom>_>::~unique_ptr
            (&local_20);
  sigprocmask(2,(sigset_t *)0x0,(sigset_t *)local_b0);
  sigaddset((sigset_t *)local_b0,0xd);
  sigprocmask(2,(sigset_t *)local_b0,(sigset_t *)0x0);
  for (dispatcher.super___shared_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi._4_4_ = 0;
      dispatcher.super___shared_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ < local_14;
      dispatcher.super___shared_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ = dispatcher.super___shared_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi._4_4_ + 1) {
    std::enable_shared_from_this<cppnet::CppNetBase>::shared_from_this(&local_d8);
    std::make_shared<cppnet::Dispatcher,std::shared_ptr<cppnet::CppNetBase>>
              ((shared_ptr<cppnet::CppNetBase> *)local_c8);
    std::shared_ptr<cppnet::CppNetBase>::~shared_ptr((shared_ptr<cppnet::CppNetBase> *)&local_d8);
    std::
    vector<std::shared_ptr<cppnet::Dispatcher>,_std::allocator<std::shared_ptr<cppnet::Dispatcher>_>_>
    ::push_back(&this->_dispatchers,(value_type *)local_c8);
    std::shared_ptr<cppnet::Dispatcher>::~shared_ptr((shared_ptr<cppnet::Dispatcher> *)local_c8);
  }
  return;
}

Assistant:

void CppNetBase::Init(uint32_t thread_num) {
    uint32_t cpus = GetCpuNum();
    if (thread_num == 0 || thread_num >= cpus * 2) {
        thread_num = cpus;
    }
    _random = std::unique_ptr<RangeRandom>(new RangeRandom(0, thread_num - 1));

#ifndef __win__
    //Disable  SIGPIPE signal
    sigset_t set;
    sigprocmask(SIG_SETMASK, NULL, &set);
    sigaddset(&set, SIGPIPE);
    sigprocmask(SIG_SETMASK, &set, NULL);
#endif

    for (uint32_t i = 0; i < thread_num; i++) {
        auto dispatcher = std::make_shared<Dispatcher>(shared_from_this());
        _dispatchers.push_back(dispatcher);
    }
}